

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O3

bool __thiscall duckdb::ArrayColumnData::IsPersistent(ArrayColumnData *this)

{
  int iVar1;
  ColumnSegment *segment;
  __pointer_type pCVar2;
  pointer pCVar3;
  
  pCVar2 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                     (&(this->validity).super_ColumnData.data.
                       super_SegmentTree<duckdb::ColumnSegment,_false>);
  while( true ) {
    if (pCVar2 == (ColumnSegment *)0x0) {
      pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(&this->child_column);
      iVar1 = (*pCVar3->_vptr_ColumnData[0x1e])(pCVar3);
      return SUB41(iVar1,0);
    }
    if (pCVar2->segment_type != PERSISTENT) break;
    pCVar2 = (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
  }
  return false;
}

Assistant:

bool ArrayColumnData::IsPersistent() {
	return validity.IsPersistent() && child_column->IsPersistent();
}